

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2SparseBricks.cpp
# Opt level: O3

brick_volume * idx2::GetBrickVolume(brick_volume *__return_storage_ptr__,brick_pool *Bp,v3i *Brick3)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  idx2_file *piVar5;
  i64 iVar6;
  allocator *paVar7;
  byte *pbVar8;
  u64 uVar9;
  u64 uVar10;
  undefined7 uVar11;
  i8 iVar12;
  bool bVar13;
  bool bVar14;
  undefined4 uVar15;
  i8 iVar16;
  u64 uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  uint in_R8D;
  uint uVar23;
  int iVar25;
  int iVar26;
  v3i Brick3_00;
  v3i Brick3_01;
  u64 AKey;
  iterator AbIt;
  unsigned_long *local_58;
  iterator local_50;
  ulong uVar24;
  
  Brick3_00.field_0.field_0.Y = 0;
  Brick3_00.field_0.field_0.X = (Brick3->field_0).field_0.Z;
  Brick3_00.field_0.field_0.Z = in_R8D;
  uVar24 = (ulong)in_R8D;
  uVar17 = GetLinearBrick((idx2 *)Bp->Idx2,(idx2_file *)0x0,(int)*(undefined8 *)&Brick3->field_0,
                          Brick3_00);
  Brick3_01.field_0._0_8_ = (unsigned_long *)(Bp->ResolutionLevels).Buffer.Data;
  bVar1 = *(byte *)((long)Brick3_01.field_0._0_8_ + uVar17);
  uVar21 = (uint)(char)bVar1;
  if (bVar1 == 0) {
    local_58 = (unsigned_long *)(uVar17 << 4);
    Lookup<unsigned_long,idx2::brick_volume>
              (&local_50,(idx2 *)Bp,(hash_table<unsigned_long,_idx2::brick_volume> *)&local_58,
               Brick3_01.field_0._0_8_);
    piVar5 = Bp->Idx2;
    uVar21 = (piVar5->BrickDimsExt3).field_0.field_0.X;
    uVar23 = (piVar5->BrickDimsExt3).field_0.field_0.Y;
    uVar22 = (piVar5->BrickDimsExt3).field_0.field_0.Z;
    ((local_50.Val)->ExtentLocal).From = 0;
    ((local_50.Val)->ExtentLocal).Dims =
         (ulong)(uVar22 & 0x1fffff) << 0x2a |
         ((ulong)uVar23 & 0x1fffff) << 0x15 | (ulong)uVar21 & 0x1fffff;
    iVar6 = ((local_50.Val)->Vol).Buffer.Bytes;
    paVar7 = ((local_50.Val)->Vol).Buffer.Alloc;
    uVar17 = ((local_50.Val)->Vol).Dims;
    (__return_storage_ptr__->Vol).Buffer.Data = ((local_50.Val)->Vol).Buffer.Data;
    (__return_storage_ptr__->Vol).Buffer.Bytes = iVar6;
    (__return_storage_ptr__->Vol).Buffer.Alloc = paVar7;
    (__return_storage_ptr__->Vol).Dims = uVar17;
    uVar11 = *(undefined7 *)&((local_50.Val)->Vol).field_0x21;
    (__return_storage_ptr__->Vol).Type = ((local_50.Val)->Vol).Type;
    *(undefined7 *)&(__return_storage_ptr__->Vol).field_0x21 = uVar11;
    (__return_storage_ptr__->ExtentLocal).From = ((local_50.Val)->ExtentLocal).From;
    (__return_storage_ptr__->ExtentLocal).Dims = ((local_50.Val)->ExtentLocal).Dims;
    iVar12 = (local_50.Val)->NChildrenMax;
    bVar13 = (local_50.Val)->Significant;
    bVar14 = (local_50.Val)->DoneDecoding;
    uVar15 = *(undefined4 *)&(local_50.Val)->field_0x3c;
    __return_storage_ptr__->NChildrenDecoded = (local_50.Val)->NChildrenDecoded;
    __return_storage_ptr__->NChildrenMax = iVar12;
    __return_storage_ptr__->Significant = bVar13;
    __return_storage_ptr__->DoneDecoding = bVar14;
    *(undefined4 *)&__return_storage_ptr__->field_0x3c = uVar15;
  }
  else {
    uVar23 = 1;
    iVar19 = 1;
    piVar5 = Bp->Idx2;
    if ((char)bVar1 < '\x01') {
      iVar26 = 1;
    }
    else {
      iVar26 = 1;
      uVar22 = uVar21;
      do {
        iVar26 = iVar26 * (piVar5->GroupBrick3).field_0.field_0.Z;
        uVar23 = (piVar5->GroupBrick3).field_0.field_0.X * uVar23;
        uVar24 = (ulong)uVar23;
        iVar19 = iVar19 * (piVar5->GroupBrick3).field_0.field_0.Y;
        uVar22 = uVar22 - 1;
      } while (uVar22 != 0);
    }
    Brick3_01.field_0._0_8_ =
         (unsigned_long *)((long)(Brick3->field_0).field_0.Z / (long)iVar26 & 0xffffffff);
    Brick3_01.field_0._8_4_ = (undefined4)uVar24;
    uVar17 = GetLinearBrick((idx2 *)piVar5,(idx2_file *)(ulong)uVar21,
                            (Brick3->field_0).field_0.X / (int)uVar23,Brick3_01);
    local_58 = (unsigned_long *)(uVar17 * 0x10 + (long)(int)uVar21);
    Lookup<unsigned_long,idx2::brick_volume>
              (&local_50,(idx2 *)Bp,(hash_table<unsigned_long,_idx2::brick_volume> *)&local_58,
               Brick3_01.field_0._0_8_);
    iVar2 = (Brick3->field_0).field_0.X;
    iVar3 = (Brick3->field_0).field_0.Y;
    iVar4 = (Brick3->field_0).field_0.Z;
    piVar5 = Bp->Idx2;
    iVar20 = 1 << (bVar1 & 0x1f);
    iVar18 = (piVar5->BrickDims3).field_0.field_0.X / iVar20;
    iVar25 = (piVar5->BrickDims3).field_0.field_0.Y / iVar20;
    iVar20 = (piVar5->BrickDims3).field_0.field_0.Z / iVar20;
    pbVar8 = ((local_50.Val)->Vol).Buffer.Data;
    iVar6 = ((local_50.Val)->Vol).Buffer.Bytes;
    paVar7 = ((local_50.Val)->Vol).Buffer.Alloc;
    uVar17 = ((local_50.Val)->Vol).Dims;
    uVar11 = *(undefined7 *)&((local_50.Val)->Vol).field_0x21;
    uVar9 = ((local_50.Val)->ExtentLocal).From;
    uVar10 = ((local_50.Val)->ExtentLocal).Dims;
    iVar12 = (local_50.Val)->NChildrenDecoded;
    iVar16 = (local_50.Val)->NChildrenMax;
    bVar13 = (local_50.Val)->Significant;
    bVar14 = (local_50.Val)->DoneDecoding;
    uVar15 = *(undefined4 *)&(local_50.Val)->field_0x3c;
    (__return_storage_ptr__->Vol).Type = ((local_50.Val)->Vol).Type;
    *(undefined7 *)&(__return_storage_ptr__->Vol).field_0x21 = uVar11;
    (__return_storage_ptr__->ExtentLocal).From = uVar9;
    (__return_storage_ptr__->ExtentLocal).Dims = uVar10;
    __return_storage_ptr__->NChildrenDecoded = iVar12;
    __return_storage_ptr__->NChildrenMax = iVar16;
    __return_storage_ptr__->Significant = bVar13;
    __return_storage_ptr__->DoneDecoding = bVar14;
    *(undefined4 *)&__return_storage_ptr__->field_0x3c = uVar15;
    (__return_storage_ptr__->Vol).Buffer.Data = pbVar8;
    (__return_storage_ptr__->Vol).Buffer.Bytes = iVar6;
    (__return_storage_ptr__->Vol).Buffer.Alloc = paVar7;
    (__return_storage_ptr__->Vol).Dims = uVar17;
    (__return_storage_ptr__->ExtentLocal).From =
         (ulong)((iVar4 % iVar26) * iVar20 & 0x1fffff) << 0x2a |
         (ulong)((iVar3 % iVar19) * iVar25 & 0x1fffff) << 0x15 |
         (ulong)((iVar2 % (int)uVar23) * iVar18 & 0x1fffff);
    (__return_storage_ptr__->ExtentLocal).Dims =
         (ulong)((uint)(1 < iVar20) + iVar20 & 0x1fffff) << 0x2a |
         (ulong)((uint)(1 < iVar25) + iVar25 & 0x1fffff) << 0x15 |
         (ulong)((uint)(1 < iVar18) + iVar18 & 0x1fffff);
    __return_storage_ptr__->Significant = false;
  }
  return __return_storage_ptr__;
}

Assistant:

brick_volume
GetBrickVolume(brick_pool* Bp, const v3i& Brick3)
{
  const i8 Level = 0;
  u64 BrickIndex = GetLinearBrick(*Bp->Idx2, Level, Brick3);
  i8 Resolution = Bp->ResolutionLevels[BrickIndex];

  if (Resolution == 0)
  {
    u64 BrickKey = GetBrickKey(Level, BrickIndex);
    auto BrickIt = Lookup(Bp->BrickTable, BrickKey);
    idx2_Assert(BrickIt);
    BrickIt.Val->ExtentLocal = extent(Bp->Idx2->BrickDimsExt3);
    return *BrickIt.Val;
  }

  /* if resolution > 0, we need to find the ancestor */
  v3i GroupBrick3 = Pow(Bp->Idx2->GroupBrick3, Resolution);
  v3i ABrick3 = Brick3 / GroupBrick3;
  u64 ABrick = GetLinearBrick(*Bp->Idx2, Resolution, ABrick3);
  u64 AKey = GetBrickKey(Resolution, ABrick);
  auto AbIt = Lookup(Bp->BrickTable, AKey);
  idx2_Assert(AbIt);
  v3i D3 = Dims(AbIt.Val->Vol);
  v3i E3 = Dims(AbIt.Val->ExtentLocal);

  v3i LocalBrickPos3 = Brick3 % GroupBrick3;
  v3i BrickDims3 = (Bp->Idx2->BrickDims3 / (1 << Resolution));
  v3i BrickDimsExt3 = idx2_ExtDims(BrickDims3);
  brick_volume BrickVol = *AbIt.Val;
  BrickVol.ExtentLocal = extent(LocalBrickPos3 * BrickDims3, BrickDimsExt3);
  BrickVol.Significant = false;
  // BrickVol.NChildrenMax or NChildrenDecoded?

  return BrickVol;
}